

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O3

wstring * __thiscall
mjs::(anonymous_namespace)::stringify_state::nest::end_gap_abi_cxx11_
          (wstring *__return_storage_ptr__,void *this)

{
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *pbVar1;
  wstring *extraout_RAX;
  
  if (*(long *)(*this + 0x68) != 0) {
    pbVar1 = std::operator+(__return_storage_ptr__,L"\n",
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)((long)this + 8));
    return pbVar1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)__return_storage_ptr__,L"");
  return extraout_RAX;
}

Assistant:

std::wstring end_gap() const {
            return state_.gap_.empty() ? L"" : L"\n" + step_back_;
        }